

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

void arg_log_r(ps_config_t *cmdln,ps_arg_t *defn,int32 doc,int32 lineno)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  void *__base;
  ulong uVar4;
  cmd_ln_val_t *pcVar5;
  char *pcVar6;
  char *fmt;
  char **ppcVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  lVar11 = 0;
  uVar9 = 0;
  iVar10 = 0;
  iVar12 = 0;
  for (ppcVar7 = &defn->deflt; ((ps_arg_t *)(ppcVar7 + -2))->name != (char *)0x0;
      ppcVar7 = ppcVar7 + 4) {
    sVar3 = strlen(((ps_arg_t *)(ppcVar7 + -2))->name);
    iVar2 = (int)sVar3 + 1;
    if (iVar10 <= iVar2) {
      iVar10 = iVar2;
    }
    iVar2 = 6;
    if (*ppcVar7 != (char *)0x0) {
      sVar3 = strlen(*ppcVar7);
      iVar2 = (int)sVar3;
    }
    if (iVar12 <= iVar2) {
      iVar12 = iVar2;
    }
    uVar9 = uVar9 + 1;
    lVar11 = lVar11 + 0x100000000;
  }
  uVar8 = 0;
  err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)(iVar10 + 4U),"[NAME]");
  err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)(iVar12 + 4U),"[DEFLT]");
  pcVar6 = "     [DESCR]\n";
  if (doc == 0) {
    pcVar6 = "    [VALUE]\n";
  }
  err_msg(ERR_INFO,(char *)0x0,0,pcVar6);
  __base = __ckd_calloc__(lVar11 >> 0x20,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x85);
  uVar4 = 0;
  if (0 < (int)uVar9) {
    uVar4 = (ulong)uVar9;
  }
  for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
    *(ps_arg_t **)((long)__base + uVar8 * 8) = defn;
    defn = defn + 1;
  }
  qsort(__base,lVar11 >> 0x20,8,cmp_name);
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar8 = 0;
  do {
    if (uVar9 == uVar8) {
      ckd_free(__base);
      err_msg(ERR_INFO,(char *)0x0,0,"\n");
      return;
    }
    err_msg(ERR_INFO,(char *)0x0,0,"-%-*s",(ulong)(iVar10 + 4U),
            **(undefined8 **)((long)__base + uVar8 * 8));
    pcVar6 = *(char **)(*(long *)((long)__base + uVar8 * 8) + 0x10);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)(iVar12 + 4U),pcVar6);
    puVar1 = *(undefined8 **)((long)__base + uVar8 * 8);
    if (doc == 0) {
      pcVar5 = cmd_ln_access_r(cmdln,(char *)*puVar1);
      if (pcVar5 != (cmd_ln_val_t *)0x0) {
        switch(*(undefined4 *)(*(long *)((long)__base + uVar8 * 8) + 8)) {
        case 2:
        case 3:
          pcVar6 = (char *)(pcVar5->val).ptr;
          fmt = "    %ld";
          goto LAB_0010a3e0;
        case 4:
        case 5:
          err_msg(ERR_INFO,(char *)0x0,0,"    %e",(pcVar5->val).ptr);
          break;
        default:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0xf3,"Unknown argument type: %d\n");
          break;
        case 8:
        case 9:
          pcVar6 = (char *)(pcVar5->val).ptr;
          goto LAB_0010a3c9;
        case 0x10:
        case 0x11:
          pcVar6 = "yes";
          if ((pcVar5->val).ptr == (void *)0x0) {
            pcVar6 = "no";
          }
          goto LAB_0010a3d2;
        }
      }
    }
    else {
      pcVar6 = (char *)puVar1[3];
LAB_0010a3c9:
      if (pcVar6 != (char *)0x0) {
LAB_0010a3d2:
        fmt = "    %s";
LAB_0010a3e0:
        err_msg(ERR_INFO,(char *)0x0,0,fmt,pcVar6);
      }
    }
    err_msg(ERR_INFO,(char *)0x0,0,"\n");
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static void
arg_log_r(ps_config_t *cmdln, const ps_arg_t * defn, int32 doc, int32 lineno)
{
    ps_arg_t const **pos;
    int32 i, n;
    int32 namelen, deflen;
    cmd_ln_val_t const *vp;

    /* No definitions, do nothing. */
    if (defn == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    namelen += 4;
    deflen += 4;
    if (lineno)
        E_INFO("%-*s", namelen, "[NAME]");
    else
        E_INFOCONT("%-*s", namelen, "[NAME]");
    E_INFOCONT("%-*s", deflen, "[DEFLT]");
    if (doc) {
        E_INFOCONT("     [DESCR]\n");
    }
    else {
        E_INFOCONT("    [VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        if (lineno)
            E_INFO("-%-*s", namelen, pos[i]->name);
        else
            E_INFOCONT("-%-*s", namelen, pos[i]->name);
        if (pos[i]->deflt)
            E_INFOCONT("%-*s", deflen, pos[i]->deflt);
        else
            E_INFOCONT("%-*s", deflen, "");
        if (doc) {
            if (pos[i]->doc)
                E_INFOCONT("    %s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    E_INFOCONT("    %ld", vp->val.i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    E_INFOCONT("    %e", vp->val.fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->val.ptr)
                        E_INFOCONT("    %s", (char *)vp->val.ptr);
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    E_INFOCONT("    %s", vp->val.i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        E_INFOCONT("\n");
    }
    ckd_free(pos);
    E_INFOCONT("\n");
}